

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::SimpleFactory::getDisplayName
          (SimpleFactory *this,UnicodeString *id,Locale *param_2,UnicodeString *result)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int len;
  int32_t iVar4;
  bool bVar5;
  
  if (this->_visible != '\0') {
    uVar1 = (this->_id).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (this->_id).fUnion.fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (id->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (id->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      bVar5 = false;
      if ((((int)sVar2 & 1U) == 0) && (bVar5 = false, len == iVar4)) {
        UVar3 = UnicodeString::doEquals(&this->_id,id,len);
        bVar5 = UVar3 != '\0';
      }
    }
    else {
      bVar5 = (bool)(*(byte *)&id->fUnion & 1);
    }
    if (bVar5 != false) {
      UnicodeString::operator=(result,&this->_id);
      return result;
    }
  }
  UnicodeString::setToBogus(result);
  return result;
}

Assistant:

UnicodeString& 
SimpleFactory::getDisplayName(const UnicodeString& id, const Locale& /* locale */, UnicodeString& result) const 
{
    if (_visible && _id == id) {
        result = _id;
    } else {
        result.setToBogus();
    }
    return result;
}